

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O2

int emit_dqt(j_compress_ptr cinfo,int index)

{
  ushort uVar1;
  JQUANT_TBL *pJVar2;
  jpeg_error_mgr *pjVar3;
  long lVar4;
  int iVar5;
  int value;
  
  pJVar2 = cinfo->quant_tbl_ptrs[index];
  if (pJVar2 == (JQUANT_TBL *)0x0) {
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x36;
    (pjVar3->msg_parm).i[0] = index;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  iVar5 = 0;
  for (lVar4 = 0; lVar4 <= cinfo->lim_Se; lVar4 = lVar4 + 1) {
    if (0xff < pJVar2->quantval[cinfo->natural_order[lVar4]]) {
      iVar5 = 1;
    }
  }
  if (pJVar2->sent_table == 0) {
    emit_marker(cinfo,M_DQT);
    value = cinfo->lim_Se * 2 + 5;
    if (iVar5 == 0) {
      value = cinfo->lim_Se + 4;
    }
    emit_2bytes(cinfo,value);
    emit_byte(cinfo,iVar5 * 0x10 + index);
    for (lVar4 = 0; lVar4 <= cinfo->lim_Se; lVar4 = lVar4 + 1) {
      uVar1 = pJVar2->quantval[cinfo->natural_order[lVar4]];
      if (iVar5 != 0) {
        emit_byte(cinfo,(uint)(uVar1 >> 8));
      }
      emit_byte(cinfo,uVar1 & 0xff);
    }
    pJVar2->sent_table = 1;
  }
  return iVar5;
}

Assistant:

LOCAL(int)
emit_dqt (j_compress_ptr cinfo, int index)
/* Emit a DQT marker */
/* Returns the precision used (0 = 8bits, 1 = 16bits) for baseline checking */
{
  JQUANT_TBL * qtbl = cinfo->quant_tbl_ptrs[index];
  int prec;
  int i;

  if (qtbl == NULL)
    ERREXIT1(cinfo, JERR_NO_QUANT_TABLE, index);

  prec = 0;
  for (i = 0; i <= cinfo->lim_Se; i++) {
    if (qtbl->quantval[cinfo->natural_order[i]] > 255)
      prec = 1;
  }

  if (! qtbl->sent_table) {
    emit_marker(cinfo, M_DQT);

    emit_2bytes(cinfo,
      prec ? cinfo->lim_Se * 2 + 2 + 1 + 2 : cinfo->lim_Se + 1 + 1 + 2);

    emit_byte(cinfo, index + (prec<<4));

    for (i = 0; i <= cinfo->lim_Se; i++) {
      /* The table entries must be emitted in zigzag order. */
      unsigned int qval = qtbl->quantval[cinfo->natural_order[i]];
      if (prec)
	emit_byte(cinfo, (int) (qval >> 8));
      emit_byte(cinfo, (int) (qval & 0xFF));
    }

    qtbl->sent_table = TRUE;
  }

  return prec;
}